

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

int __thiscall
QCommonListViewBase::verticalScrollToValue
          (QCommonListViewBase *this,int param_2,ScrollHint hint,bool above,bool below,QRect *area,
          QRect *rect)

{
  byte bVar1;
  int xp2;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  byte in_CL;
  byte bVar6;
  int in_EDX;
  byte in_R8B;
  undefined8 in_R9;
  long in_FS_OFFSET;
  int verticalValue;
  QRect adjusted;
  QRect *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined6 in_stack_ffffffffffffffc8;
  int local_20;
  int local_1c;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar6 = in_CL & 1;
  bVar1 = in_R8B & 1;
  verticalScrollBar((QCommonListViewBase *)0x880f1f);
  xp2 = QAbstractSlider::value
                  ((QAbstractSlider *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90))
  ;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  spacing((QCommonListViewBase *)0x880f5a);
  spacing((QCommonListViewBase *)0x880f6e);
  iVar2 = spacing((QCommonListViewBase *)0x880f82);
  spacing((QCommonListViewBase *)0x880f90);
  local_18 = (undefined1  [16])
             QRect::adjusted((QRect *)CONCAT17(bVar6,CONCAT16(bVar1,in_stack_ffffffffffffffc8)),
                             (int)((ulong)in_R9 >> 0x20),(int)in_R9,xp2,iVar2);
  if ((in_EDX == 1) || ((bVar6 & 1) != 0)) {
    iVar2 = QRect::top((QRect *)0x880fcb);
    xp2 = iVar2 + xp2;
  }
  else if ((in_EDX == 2) || ((bVar1 & 1) != 0)) {
    local_1c = QRect::top((QRect *)0x880ff0);
    iVar2 = QRect::bottom((QRect *)0x880ffe);
    iVar3 = QRect::height(in_stack_ffffffffffffff88);
    local_20 = (iVar2 - iVar3) + 1;
    piVar5 = qMin<int>(&local_1c,&local_20);
    xp2 = *piVar5 + xp2;
  }
  else if (in_EDX == 3) {
    iVar2 = QRect::top((QRect *)0x881047);
    iVar3 = QRect::height(in_stack_ffffffffffffff88);
    iVar4 = QRect::height(in_stack_ffffffffffffff88);
    xp2 = (iVar2 - (iVar3 - iVar4) / 2) + xp2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return xp2;
}

Assistant:

int QCommonListViewBase::verticalScrollToValue(int /*index*/, QListView::ScrollHint hint,
                                          bool above, bool below, const QRect &area, const QRect &rect) const
{
    int verticalValue = verticalScrollBar()->value();
    QRect adjusted = rect.adjusted(-spacing(), -spacing(), spacing(), spacing());
    if (hint == QListView::PositionAtTop || above)
        verticalValue += adjusted.top();
    else if (hint == QListView::PositionAtBottom || below)
        verticalValue += qMin(adjusted.top(), adjusted.bottom() - area.height() + 1);
    else if (hint == QListView::PositionAtCenter)
        verticalValue += adjusted.top() - ((area.height() - adjusted.height()) / 2);
    return verticalValue;
}